

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

string * __thiscall Cmd::readlineNoTTY_abi_cxx11_(string *__return_storage_ptr__,Cmd *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar5 = false;
  do {
    iVar4 = fgetc((FILE *)this->in_);
    bVar3 = true;
    if ((iVar4 != -1) && (iVar4 != 10)) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar3 = bVar5;
    }
  } while ((iVar4 != 10) && (bVar5 = bVar3, iVar4 != -1));
  if ((!bVar3) &&
     (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != paVar1)) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string readlineNoTTY() const {
		std::string line;

		while (true) {
			const int ch = fgetc(in_);
			if (ch == EOF || ch == '\n') {
				return line;
			} else {
				line.push_back(ch);
			}
		}
	}